

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O3

void EPSG_writeReg(EPSG *psg,UINT8 reg,UINT8 val)

{
  byte bVar1;
  uint8_t uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  undefined1 auVar6 [16];
  
  if (reg < 0x10) {
    uVar3 = (ulong)reg;
    bVar4 = val & regmsk[uVar3];
    psg->reg[uVar3] = bVar4;
    uVar5 = (uint)CONCAT71(in_register_00000031,reg);
    switch(uVar3) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      *(ushort *)((long)psg->freq + (ulong)(uVar5 & 0xfffffffe)) =
           (ushort)psg->reg[uVar5 & 0xe] |
           (psg->reg[CONCAT71(in_register_00000031,reg) & 0xffffffff | 1] & 0xf) << 8;
      return;
    case 6:
      psg->noise_freq = bVar4 * '\x02' & 0x3e;
      return;
    case 7:
      auVar6 = pshuflw(ZEXT216(CONCAT11(bVar4,bVar4)),ZEXT216(CONCAT11(bVar4,bVar4)),0);
      uVar5 = auVar6._0_4_ & (uint)DAT_0017bfd0;
      psg->tmask[0] = (char)uVar5;
      psg->tmask[1] = (char)(uVar5 >> 8);
      psg->tmask[2] = (char)(uVar5 >> 0x10);
      psg->nmask[0] = (char)(uVar5 >> 0x18);
      psg->nmask[1] = bVar4 & 0x10;
      psg->nmask[2] = bVar4 & 0x20;
      return;
    case 8:
    case 9:
    case 10:
      psg->volume[uVar5 - 8] = bVar4 * '\x02';
      return;
    case 0xb:
    case 0xc:
      psg->env_freq = (uint)*(ushort *)(psg->reg + 0xb);
      return;
    case 0xd:
      psg->env_continue = bVar4 >> 3 & 1;
      bVar1 = bVar4 >> 2 & 1;
      psg->env_attack = bVar1;
      psg->env_alternate = bVar4 >> 1 & 1;
      psg->env_hold = bVar4 & 1;
      psg->env_face = bVar1;
      psg->env_pause = '\0';
      psg->env_count = 0x10000 - psg->env_freq;
      uVar2 = '\x1f';
      if (bVar1 != 0) {
        uVar2 = '\0';
      }
      psg->env_ptr = uVar2;
      return;
    }
  }
  return;
}

Assistant:

void
EPSG_writeReg (EPSG * psg, UINT8 reg, UINT8 val)
{
  int c;

  if (reg > 15) return;

  val &= regmsk[reg];

  psg->reg[reg] = val;
  switch (reg)
  {
  case 0:
  case 2:
  case 4:
  case 1:
  case 3:
  case 5:
    c = reg >> 1;
    psg->freq[c] = ((psg->reg[c * 2 + 1] & 15) << 8) + psg->reg[c * 2];
    break;

  case 6:
    psg->noise_freq = (val & 31) << 1;
    break;

  case 7:
    psg->tmask[0] = (val & 1);
    psg->tmask[1] = (val & 2);
    psg->tmask[2] = (val & 4);
    psg->nmask[0] = (val & 8);
    psg->nmask[1] = (val & 16);
    psg->nmask[2] = (val & 32);
    break;

  case 8:
  case 9:
  case 10:
    psg->volume[reg - 8] = val << 1;
    break;

  case 11:
  case 12:
    psg->env_freq = (psg->reg[12] << 8) + psg->reg[11];
    break;

  case 13:
    psg->env_continue = (val >> 3) & 1;
    psg->env_attack = (val >> 2) & 1;
    psg->env_alternate = (val >> 1) & 1;
    psg->env_hold = val & 1;
    psg->env_face = psg->env_attack;
    psg->env_pause = 0;
    psg->env_count = 0x10000 - psg->env_freq;
    psg->env_ptr = psg->env_face?0:0x1f;
    break;

  case 14:
  case 15:
  default:
    break;
  }

  return;
}